

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.h
# Opt level: O2

void __thiscall
ReadOnlyStringCallback::ReadOnlyStringCallback
          (ReadOnlyStringCallback *this,SortableOIDType *oid,string *value)

{
  (this->super_ValueCallback).OID = oid;
  (this->super_ValueCallback).type = STRING;
  (this->super_ValueCallback).isSettable = false;
  (this->super_ValueCallback).setOccurred = false;
  (this->super_ValueCallback)._vptr_ValueCallback = (_func_int **)&PTR_buildTypeWithValue_0019ba70;
  std::__cxx11::string::string((string *)&this->value,(string *)value);
  return;
}

Assistant:

ReadOnlyStringCallback(SortableOIDType* oid, const std::string &value): ValueCallback(oid, STRING), value(value) {}